

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

int __thiscall QtMWidgets::TableViewCellLayout::heightForWidth(TableViewCellLayout *this,int w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int height;
  int local_38;
  undefined1 auStack_34 [4];
  int textWidth;
  QMargins m;
  QSize accessorySize;
  QSize imageSize;
  int w_local;
  TableViewCellLayout *this_local;
  
  accessorySize = (QSize)(**(code **)(*(long *)this->imageLabel + 0x70))();
  m._8_8_ = (**(code **)(*(long *)this->accessoryWidget + 0x70))();
  auVar5 = QLayout::contentsMargins();
  m._0_8_ = auVar5._8_8_;
  _auStack_34 = auVar5._0_8_;
  height = 10;
  iVar1 = QSize::width(&accessorySize);
  local_40 = QSize::width((QSize *)&m.m_right);
  local_40 = (w - iVar1) - local_40;
  piVar4 = qMax<int>(&height,&local_40);
  local_38 = *piVar4;
  iVar1 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,local_38);
  iVar2 = (**(code **)(*(long *)this->detailedTextLabel + 0x80))(this->detailedTextLabel,local_38);
  iVar3 = QMargins::top((QMargins *)auStack_34);
  local_44 = QMargins::bottom((QMargins *)auStack_34);
  local_44 = iVar1 + iVar2 + iVar3 + local_44;
  iVar1 = QSize::height(&accessorySize);
  iVar2 = QMargins::top((QMargins *)auStack_34);
  local_48 = QMargins::bottom((QMargins *)auStack_34);
  local_48 = iVar1 + iVar2 + local_48;
  piVar4 = qMax<int>(&local_44,&local_48);
  local_44 = *piVar4;
  iVar1 = QSize::height((QSize *)&m.m_right);
  iVar2 = QMargins::top((QMargins *)auStack_34);
  local_4c = QMargins::bottom((QMargins *)auStack_34);
  local_4c = iVar1 + iVar2 + local_4c;
  piVar4 = qMax<int>(&local_44,&local_4c);
  return *piVar4;
}

Assistant:

int
TableViewCellLayout::heightForWidth( int w ) const
{
	const QSize imageSize = imageLabel->sizeHint();
	const QSize accessorySize = accessoryWidget->sizeHint();
	const QMargins m = contentsMargins();

	const int textWidth = qMax( 10,
		w - imageSize.width() - accessorySize.width() );

	int height = textLabel->heightForWidth( textWidth ) +
		detailedTextLabel->heightForWidth( textWidth ) + m.top() + m.bottom();

	height = qMax( height, imageSize.height() + m.top() + m.bottom() );
	height = qMax( height, accessorySize.height() + m.top() + m.bottom() );

	return height;
}